

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_object_visitor.hpp
# Opt level: O1

bool __thiscall
msgpack::v2::detail::create_object_visitor::visit_str
          (create_object_visitor *this,char *v,uint32_t size)

{
  char **ppcVar1;
  object *poVar2;
  zone *pzVar3;
  bool bVar4;
  ulong uVar5;
  chunk *pcVar6;
  str_size_overflow *this_00;
  undefined8 *puVar7;
  object *__dest;
  ulong uVar8;
  ulong __n;
  
  __n = (ulong)size;
  if ((this->m_limit).str_ < __n) {
    this_00 = (str_size_overflow *)__cxa_allocate_exception(0x10);
    v1::str_size_overflow::str_size_overflow(this_00,"str size overflow");
    __cxa_throw(this_00,&v1::str_size_overflow::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = (this->m_stack).
           super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>._M_impl
           .super__Vector_impl_data._M_finish[-1];
  (poVar2->super_object).type = STR;
  if ((this->m_func == (unpack_reference_func)0x0) ||
     (bVar4 = (*this->m_func)(STR,__n,this->m_user_data), !bVar4)) {
    if (v == (char *)0x0) {
      (poVar2->super_object).via.array.ptr = (object *)0x0;
      (poVar2->super_object).via.array.size = 0;
    }
    else {
      pzVar3 = this->m_zone;
      if ((pzVar3->m_chunk_list).m_free < __n) {
        uVar5 = pzVar3->m_chunk_size;
        do {
          uVar8 = uVar5;
          if (__n <= uVar5) break;
          bVar4 = 0 < (long)uVar5;
          uVar5 = uVar5 * 2;
          uVar8 = __n;
        } while (bVar4);
        pcVar6 = (chunk *)malloc(uVar8 + 8);
        if (pcVar6 == (chunk *)0x0) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = std::ostream::operator<<;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        __dest = (object *)(pcVar6 + 1);
        pcVar6->m_next = (pzVar3->m_chunk_list).m_head;
        (pzVar3->m_chunk_list).m_head = pcVar6;
        (pzVar3->m_chunk_list).m_free = uVar8;
        (pzVar3->m_chunk_list).m_ptr = (char *)__dest;
      }
      else {
        __dest = (object *)(pzVar3->m_chunk_list).m_ptr;
      }
      (pzVar3->m_chunk_list).m_free = (pzVar3->m_chunk_list).m_free - __n;
      ppcVar1 = &(pzVar3->m_chunk_list).m_ptr;
      *ppcVar1 = *ppcVar1 + __n;
      memcpy(__dest,v,__n);
      (poVar2->super_object).via.array.ptr = __dest;
      (poVar2->super_object).via.array.size = size;
    }
  }
  else {
    (poVar2->super_object).via.str.ptr = v;
    (poVar2->super_object).via.array.size = size;
    this->m_referenced = true;
  }
  return true;
}

Assistant:

bool visit_str(const char* v, uint32_t size) {
        MSGPACK_ASSERT(v || size == 0);
        if (size > m_limit.str()) throw msgpack::str_size_overflow("str size overflow");
        msgpack::object* obj = m_stack.back();
        obj->type = msgpack::type::STR;
        if (m_func && m_func(obj->type, size, m_user_data)) {
            obj->via.str.ptr = v;
            obj->via.str.size = size;
            set_referenced(true);
        }
        else {
            if (v) {
                char* tmp = static_cast<char*>(zone().allocate_align(size, MSGPACK_ZONE_ALIGNOF(char)));
                std::memcpy(tmp, v, size);
                obj->via.str.ptr = tmp;
                obj->via.str.size = size;
            }
            else {
                obj->via.str.ptr = MSGPACK_NULLPTR;
                obj->via.str.size = 0;
            }
        }
        return true;
    }